

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

void __thiscall slang::ast::Compilation::resolveDefParamsAndBinds(Compilation *this)

{
  SyntaxNode *pSVar1;
  bool bVar2;
  InstanceSymbol *pIVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  pointer pOVar6;
  pointer pbVar7;
  bool bVar8;
  RootSymbol *pRVar9;
  Diagnostic *pDVar10;
  DefinitionSymbol *pDVar11;
  ulong uVar12;
  Symbol *this_00;
  SyntaxNode *pSVar13;
  long lVar14;
  char cVar15;
  Compilation *visitor;
  byte *pbVar16;
  Type *pTVar17;
  undefined8 *puVar18;
  string_view sVar19;
  SourceRange SVar20;
  TimeTraceScope timeScope;
  DefParamVisitor v_1;
  anon_class_16_2_91181a89 cloneInto;
  anon_class_24_3_8f1a74c6 saveState;
  anon_class_24_3_973e07f5 copyStateInto;
  SmallVector<BindEntry,_2UL> binds;
  table_arrays<std::pair<const_std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  arrays;
  SmallVector<OverrideEntry,_4UL> overrides;
  Compilation initialClone;
  TimeTraceScope local_1dc9;
  uint local_1dc8;
  undefined1 local_1dc1;
  pointer local_1dc0;
  Compilation *local_1db8;
  value_type_pointer local_1db0;
  undefined8 *local_1da8;
  Type *local_1da0;
  ulong local_1d98;
  pointer local_1d90;
  undefined1 local_1d88 [16];
  group_type_pointer local_1d78;
  Segment SStack_1d70;
  size_t sStack_1d60;
  undefined8 local_1d48;
  long local_1d40;
  undefined1 *local_1d38;
  void *pvStack_1d30;
  size_t local_1d28;
  group_type_pointer local_1d20;
  value_type_pointer pbStack_1d18;
  ulong local_1d10;
  value_type_pointer local_1d08;
  undefined8 local_1d00 [3];
  InstanceSymbol *local_1ce8;
  pointer local_1cd8;
  undefined1 local_1cd0 [16];
  Segment local_1cc0;
  anon_class_16_2_91181a89 local_1cb0;
  anon_class_24_3_8f1a74c6 local_1ca0;
  anon_class_24_3_973e07f5 local_1c88;
  SmallVector<BindEntry,_2UL> local_1c70;
  undefined1 local_1b58 [16];
  Type *local_1b48;
  Type *pTStack_1b40;
  NetType *local_1b38;
  pointer pDStack_1b30;
  Symbol *local_1b18;
  group_type_pointer local_1b10;
  SyntaxNode *local_1b08;
  Type *pTStack_1b00;
  _Elt_pointer local_1af8;
  group_type_pointer local_1af0;
  value_type_pointer pbStack_1ae8;
  group_type_pointer local_1ae0;
  value_type_pointer local_1ad8;
  undefined1 local_1ad0 [24];
  InstanceSymbol *local_1ab8;
  SmallVector<OverrideEntry,_4UL> local_f00;
  Compilation local_c88;
  
  if (TimeTrace::profiler != 0) {
    sVar19._M_str = "resolveDefParamsAndBinds";
    sVar19._M_len = 0x18;
    TimeTrace::beginTrace(sVar19,(string_view)(ZEXT816(0x46fee9) << 0x40));
  }
  local_f00.super_SmallVectorBase<OverrideEntry>.data_ =
       (pointer)local_f00.super_SmallVectorBase<OverrideEntry>.firstElement;
  local_f00.super_SmallVectorBase<OverrideEntry>.len = 0;
  local_f00.super_SmallVectorBase<OverrideEntry>.cap = 4;
  local_1c70.super_SmallVectorBase<BindEntry>.data_ =
       (pointer)local_1c70.super_SmallVectorBase<BindEntry>.firstElement;
  local_1c70.super_SmallVectorBase<BindEntry>.len = 0;
  local_1c70.super_SmallVectorBase<BindEntry>.cap = 2;
  local_1ca0.overrides = &local_f00;
  local_1cb0.copyStateInto = &local_1c88;
  local_1c88.getNodeFor = (anon_class_1_0_00000001 *)&local_1dc1;
  local_1ca0.binds = &local_1c70;
  local_1cd8 = (pointer)local_1ad0;
  local_1da8 = local_1d00;
  local_1dc0 = (pointer)0x0;
  local_1db0 = (value_type_pointer)0x0;
  pTVar17 = (Type *)0x0;
  local_1d98 = 0;
  local_1db8 = this;
  local_1cb0.this = this;
  local_1ca0.this = this;
  local_1c88.overrides = local_1ca0.overrides;
  local_1c88.binds = local_1ca0.binds;
  do {
    local_1b58._0_8_ = (Type *)0x3f;
    local_1b58._8_8_ = (Type *)0x1;
    pTStack_1b40 = (Type *)0x0;
    local_1b48 = (Type *)&boost::unordered::detail::foa::
                          dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                          ::storage;
    local_1b38 = (NetType *)0x0;
    pDStack_1b30 = (pointer)0x0;
    Compilation(&local_c88,(Bag *)local_1b58,this->defaultLibPtr);
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
    ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                   *)local_1b58);
    resolveDefParamsAndBinds::anon_class_16_2_91181a89::operator()(&local_1cb0,&local_c88);
    do {
      local_1ae0 = (group_type_pointer)(ulong)(this->options).maxInstanceDepth;
      local_1b58._0_8_ = &pTStack_1b40;
      local_1b58._8_8_ = (Type *)0x0;
      local_1b48 = (Type *)0x5;
      local_1b18 = (Symbol *)0x3f;
      local_1b10 = (group_type_pointer)0x1;
      pTStack_1b00 = (Type *)0x0;
      local_1b08 = (SyntaxNode *)
                   &boost::unordered::detail::foa::
                    dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                    ::storage;
      local_1af8 = (_Elt_pointer)0x0;
      local_1af0 = (group_type_pointer)0x0;
      pbStack_1ae8 = (value_type_pointer)0x0;
      local_1ad8 = local_1db0;
      local_1ab8 = (InstanceSymbol *)0x0;
      (local_1cd8->_M_dataplus)._M_p = (pointer)0x0;
      local_1cd8->_M_string_length = 0;
      (local_1cd8->field_2)._M_local_buf[0] = '\0';
      pRVar9 = getRoot(&local_c88,true);
      visitor = (Compilation *)local_1b58;
      Symbol::visit<slang::ast::DefParamVisitor&>(&pRVar9->super_Symbol,(DefParamVisitor *)visitor);
      pIVar3 = local_1ab8;
      if (local_1ab8 == (InstanceSymbol *)0x0) {
LAB_001f7f83:
        uVar5 = local_1ad0._0_8_;
        uVar4 = local_1b58._8_8_;
        local_1d90 = (pointer)local_1ad0._0_8_;
        if ((pTVar17 < (ulong)local_1b58._8_8_) ||
           (local_1d98 <
            (ulong)((long)local_c88.bindDirectives.
                          super__Vector_base<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_c88.bindDirectives.
                          super__Vector_base<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4))) {
          cVar15 = '\x05';
          visitor = (Compilation *)local_1b58;
          resolveDefParamsAndBinds::anon_class_24_3_8f1a74c6::operator()
                    (&local_1ca0,(DefParamVisitor *)visitor,&local_c88);
          pTVar17 = (Type *)uVar4;
          pbVar7 = local_1dc0;
        }
        else {
          local_1db0 = (value_type_pointer)
                       ((long)&local_1db0->first + (ulong)((pointer)local_1ad0._0_8_ != local_1dc0))
          ;
          cVar15 = '\0';
          pbVar7 = (pointer)local_1ad0._0_8_;
          if ((pointer)local_1ad0._0_8_ == local_1dc0) {
            cVar15 = '\x05';
            visitor = (Compilation *)local_1b58;
            resolveDefParamsAndBinds::anon_class_24_3_8f1a74c6::operator()
                      (&local_1ca0,(DefParamVisitor *)visitor,&local_c88);
            local_1dc0 = (pointer)uVar5;
            pbVar7 = local_1dc0;
          }
        }
      }
      else {
        pDVar10 = Scope::addDiag(&((this->root)._M_t.
                                   super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                                   .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>.
                                  _M_head_impl)->super_Scope,(DiagCode)0x25000d,
                                 (local_1ab8->super_InstanceSymbolBase).super_Symbol.location);
        pDVar11 = InstanceSymbol::getDefinition(local_1ab8);
        sVar19 = DefinitionSymbol::getKindString(pDVar11);
        Diagnostic::operator<<(pDVar10,sVar19);
        local_1d88._0_8_ = ZEXT48((this->options).maxInstanceDepth);
        visitor = (Compilation *)local_1d88;
        std::
        vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ::emplace_back<unsigned_long>(&pDVar10->args,(unsigned_long *)visitor);
        cVar15 = '\x01';
        pbVar7 = local_1dc0;
        if (pIVar3 == (InstanceSymbol *)0x0) goto LAB_001f7f83;
      }
      local_1dc0 = pbVar7;
      if (pTStack_1b00 != (Type *)0x0) {
        visitor = (Compilation *)((long)local_1b10 * 0x88 + 0x90);
        operator_delete(pTStack_1b00,(size_t)visitor);
      }
      if ((Type *)local_1b58._0_8_ != (Type *)&pTStack_1b40) {
        operator_delete((void *)local_1b58._0_8_);
      }
    } while (cVar15 == '\0');
    local_1da0 = pTVar17;
    if (cVar15 == '\x05') {
      uVar12 = (long)local_c88.bindDirectives.
                     super__Vector_base<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_c88.bindDirectives.
                     super__Vector_base<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4;
      if (local_1d98 < uVar12) {
        cVar15 = '\x02';
        pTVar17 = (Type *)0x0;
        local_1d98 = uVar12;
      }
      else {
        if ((this->options).maxDefParamSteps == 0) {
          cVar15 = '\x06';
          bVar2 = true;
        }
        else {
          local_1dc8 = 0;
          bVar2 = true;
          puVar18 = local_1da8;
          do {
            local_1d88._0_8_ = (Segment *)0x3f;
            local_1d88._8_8_ = (byte *)0x1;
            SStack_1d70.prev = (Segment *)0x0;
            local_1d78 = (group_type_pointer)
                         &boost::unordered::detail::foa::
                          dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                          ::storage;
            SStack_1d70.current = (byte *)0x0;
            sStack_1d60 = 0;
            Compilation((Compilation *)local_1b58,(Bag *)local_1d88,this->defaultLibPtr);
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
            ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                           *)local_1d88);
            resolveDefParamsAndBinds::anon_class_16_2_91181a89::operator()
                      (&local_1cb0,(Compilation *)local_1b58);
            local_1d10 = (ulong)(this->options).maxInstanceDepth;
            local_1d88._0_8_ = &SStack_1d70;
            local_1d88._8_8_ = (byte *)0x0;
            local_1d78 = (group_type_pointer)0x5;
            local_1d48._0_4_ = 0x3f;
            local_1d48._4_4_ = Min;
            local_1d40 = 1;
            pvStack_1d30 = (void *)0x0;
            local_1d38 = &boost::unordered::detail::foa::
                          dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                          ::storage;
            local_1d28 = 0;
            local_1d20 = (group_type_pointer)0x0;
            pbStack_1d18 = (value_type_pointer)0x0;
            local_1d08 = local_1db0;
            local_1ce8 = (InstanceSymbol *)0x0;
            *puVar18 = 0;
            puVar18[1] = 0;
            *(undefined1 *)(puVar18 + 2) = 0;
            pRVar9 = getRoot((Compilation *)local_1b58,true);
            visitor = (Compilation *)local_1d88;
            Symbol::visit<slang::ast::DefParamVisitor&>
                      (&pRVar9->super_Symbol,(DefParamVisitor *)visitor);
            pIVar3 = local_1ce8;
            if (local_1ce8 == (InstanceSymbol *)0x0) {
LAB_001f82b6:
              cVar15 = '\v';
              if ((byte *)local_1d88._8_8_ == (byte *)0x0) {
                bVar2 = true;
              }
              else {
                bVar2 = true;
                lVar14 = 0x78;
                pbVar16 = (byte *)0x0;
                do {
                  this_00 = DefParamSymbol::getTarget
                                      ((DefParamSymbol *)
                                       ((Segment **)local_1d88._0_8_)[(long)pbVar16]);
                  pOVar6 = local_f00.super_SmallVectorBase<OverrideEntry>.data_;
                  if (this_00 == (Symbol *)0x0) {
                    pSVar13 = (SyntaxNode *)0x0;
                  }
                  else {
                    pSVar13 = this_00->originatingSyntax;
                  }
                  pSVar1 = *(SyntaxNode **)
                            (((local_f00.super_SmallVectorBase<OverrideEntry>.data_)->path).entries.
                             super_SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>.
                             firstElement + lVar14 + -0x50);
                  if (((pSVar1 == pSVar13) || (pSVar13 == (SyntaxNode *)0x0)) ||
                     (pSVar1 == (SyntaxNode *)0x0)) {
                    visitor = (Compilation *)
                              DefParamSymbol::getValue
                                        ((DefParamSymbol *)
                                         ((Segment **)local_1d88._0_8_)[(long)pbVar16]);
                    bVar8 = slang::operator==((ConstantValue *)
                                              ((pOVar6->path).entries.
                                               super_SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>
                                               .firstElement + lVar14 + -0x40),
                                              (ConstantValue *)visitor);
                    if (bVar8) {
                      cVar15 = '\0';
                      bVar8 = true;
                    }
                    else {
                      cVar15 = '\v';
                      bVar2 = false;
                      if (local_1dc8 != (local_1db8->options).maxDefParamSteps - 1)
                      goto LAB_001f8430;
                      pRVar9 = (local_1db8->root)._M_t.
                               super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                               .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
                      SVar20 = slang::syntax::SyntaxNode::sourceRange
                                         ((SyntaxNode *)
                                          ((Segment **)local_1d88._0_8_)[(long)pbVar16][3].current);
                      bVar2 = false;
                      visitor = (Compilation *)0x9000d;
                      Scope::addDiag(&pRVar9->super_Scope,(DiagCode)0x9000d,SVar20);
                      bVar8 = false;
                    }
                  }
                  else {
                    pRVar9 = (local_1db8->root)._M_t.
                             super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                             .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
                    SVar20 = slang::syntax::SyntaxNode::sourceRange
                                       ((SyntaxNode *)
                                        ((Segment **)local_1d88._0_8_)[(long)pbVar16][3].current);
                    pDVar10 = Scope::addDiag(&pRVar9->super_Scope,(DiagCode)0xa000d,SVar20);
                    Diagnostic::operator<<
                              (pDVar10,(string *)
                                       ((pOVar6->path).entries.
                                        super_SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>
                                        .firstElement + lVar14 + -0x18));
                    Symbol::getHierarchicalPath_abi_cxx11_((string *)local_1cd0,this_00);
                    visitor = (Compilation *)local_1cd0;
                    Diagnostic::operator<<(pDVar10,(string *)local_1cd0);
                    if ((Segment *)local_1cd0._0_8_ != &local_1cc0) {
                      visitor = (Compilation *)((long)&(local_1cc0.prev)->prev + 1);
                      operator_delete((void *)local_1cd0._0_8_,(size_t)visitor);
                    }
                    cVar15 = '\x01';
LAB_001f8430:
                    bVar8 = false;
                  }
                  this = local_1db8;
                  puVar18 = local_1da8;
                  if (!bVar8) break;
                  pbVar16 = pbVar16 + 1;
                  lVar14 = lVar14 + 0x98;
                  cVar15 = '\v';
                } while (pbVar16 < (ulong)local_1d88._8_8_);
              }
              if ((cVar15 == '\v') && (cVar15 = '\x06', !bVar2)) {
                cVar15 = '\0';
                visitor = (Compilation *)local_1d88;
                resolveDefParamsAndBinds::anon_class_24_3_8f1a74c6::operator()
                          (&local_1ca0,(DefParamVisitor *)visitor,(Compilation *)local_1b58);
              }
            }
            else {
              pDVar10 = Scope::addDiag(&((this->root)._M_t.
                                         super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                                         .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>.
                                        _M_head_impl)->super_Scope,(DiagCode)0x25000d,
                                       (local_1ce8->super_InstanceSymbolBase).super_Symbol.location)
              ;
              pDVar11 = InstanceSymbol::getDefinition(local_1ce8);
              sVar19 = DefinitionSymbol::getKindString(pDVar11);
              Diagnostic::operator<<(pDVar10,sVar19);
              local_1cd0._0_8_ = ZEXT48((this->options).maxInstanceDepth);
              visitor = (Compilation *)local_1cd0;
              std::
              vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
              ::emplace_back<unsigned_long>(&pDVar10->args,(unsigned_long *)local_1cd0);
              cVar15 = '\x01';
              if (pIVar3 == (InstanceSymbol *)0x0) goto LAB_001f82b6;
            }
            if (pvStack_1d30 != (void *)0x0) {
              visitor = (Compilation *)(local_1d40 * 0x88 + 0x90);
              operator_delete(pvStack_1d30,(size_t)visitor);
            }
            if ((Segment *)local_1d88._0_8_ != &SStack_1d70) {
              operator_delete((void *)local_1d88._0_8_);
            }
            ~Compilation((Compilation *)local_1b58);
            if (cVar15 != '\0') goto LAB_001f8515;
            local_1dc8 = local_1dc8 + 1;
          } while (local_1dc8 < (this->options).maxDefParamSteps);
          cVar15 = '\x06';
        }
LAB_001f8515:
        pTVar17 = local_1da0;
        if ((cVar15 == '\x06') && (cVar15 = '\x03', bVar2)) {
          local_1db0 = (value_type_pointer)
                       ((long)&local_1db0->first + (ulong)(local_1d90 != local_1dc0));
          cVar15 = (local_1d90 == local_1dc0) * '\x03';
          local_1dc0 = local_1d90;
        }
      }
    }
    ~Compilation(&local_c88);
    if ((cVar15 != '\0') && (cVar15 != '\x02')) {
      if (cVar15 == '\x03') {
        resolveDefParamsAndBinds::anon_class_24_3_973e07f5::operator()(&local_1c88,this,true);
        visitor = this;
      }
      SmallVectorBase<BindEntry>::cleanup
                (&local_1c70.super_SmallVectorBase<BindEntry>,(EVP_PKEY_CTX *)visitor);
      SmallVectorBase<OverrideEntry>::cleanup
                (&local_f00.super_SmallVectorBase<OverrideEntry>,(EVP_PKEY_CTX *)visitor);
      TimeTraceScope::~TimeTraceScope(&local_1dc9);
      return;
    }
  } while( true );
}

Assistant:

void Compilation::resolveDefParamsAndBinds() {
    TimeTraceScope timeScope("resolveDefParamsAndBinds"sv, ""sv);

    struct OverrideEntry {
        OpaqueInstancePath path;
        const SyntaxNode* targetSyntax = nullptr;
        const SyntaxNode* defparamSyntax = nullptr;
        ConstantValue value;
        std::string pathStr;
    };
    SmallVector<OverrideEntry, 4> overrides;

    struct BindEntry {
        OpaqueInstancePath path;
        const ModuleDeclarationSyntax* definitionTarget = nullptr;
        BindDirectiveInfo info;
    };
    SmallVector<BindEntry> binds;

    auto getNodeFor = [](const OpaqueInstancePath& path, Compilation& c) {
        HierarchyOverrideNode* node = &c.hierarchyOverrides;
        for (auto& entry : path.entries)
            node = &node->childNodes[entry];
        return node;
    };

    auto copyStateInto = [&](Compilation& c, bool isFinal) {
        for (auto& entry : overrides) {
            if (!entry.targetSyntax)
                continue;

            SLANG_ASSERT(entry.defparamSyntax);

            auto node = getNodeFor(entry.path, c);
            auto [it, inserted] = node->paramOverrides.emplace(
                entry.targetSyntax, std::pair{entry.value, entry.defparamSyntax});

            if (!inserted && isFinal) {
                SLANG_ASSERT(it->second.second);
                auto& diag = c.root->addDiag(diag::DuplicateDefparam,
                                             entry.defparamSyntax->sourceRange());
                diag.addNote(diag::NotePreviousDefinition, it->second.second->sourceRange());
            }
        }

        for (auto& entry : binds) {
            if (entry.definitionTarget) {
                if (!entry.path.empty()) {
                    // This is a nested definition, so we need to put the
                    // bind into the override node.
                    auto node = getNodeFor(entry.path, c);
                    node->binds.push_back({entry.info, entry.definitionTarget});
                }
                else {
                    auto def = c.getDefinition(*c.root, *entry.definitionTarget);
                    if (def) {
                        // const_cast is fine; we accessed the private data of the compilation
                        // through a public interface that added the const on top.
                        const_cast<DefinitionSymbol*>(def)->bindDirectives.push_back(entry.info);
                    }
                }
            }
            else {
                auto node = getNodeFor(entry.path, c);
                node->binds.push_back({entry.info, nullptr});
            }
        }
    };

    auto cloneInto = [&](Compilation& c) {
        c.diagsDisabled = true;
        c.options = options;
        for (auto& tree : syntaxTrees)
            c.addSyntaxTree(tree);

        copyStateInto(c, false);
    };

    auto saveState = [&](DefParamVisitor& visitor, Compilation& c) {
        overrides.clear();
        for (auto defparam : visitor.found) {
            auto target = defparam->getTarget();
            if (!target) {
                overrides.emplace_back();
            }
            else {
                overrides.push_back({OpaqueInstancePath(*target), target->getSyntax(),
                                     defparam->getSyntax(), defparam->getValue(),
                                     target->getHierarchicalPath()});
            }
        }

        // We make a copy of the bind directives list here because resolveBindTargets
        // can cause the compilation to add more entries to the list (for recursive
        // module instantiations).
        binds.clear();
        auto bindDirs = c.bindDirectives;
        for (auto [syntax, scope] : bindDirs) {
            ResolvedBind resolvedBind;
            c.resolveBindTargets(*syntax, *scope, resolvedBind);

            BindDirectiveInfo info;
            info.bindSyntax = syntax;

            auto& def = resolvedBind.instanceDef;
            info.configRuleSyntax = def.configRule ? def.configRule->syntax.get() : nullptr;
            info.configBlockSyntax = def.configRoot ? def.configRoot->getSyntax() : nullptr;
            info.instantiationDefSyntax = def.definition ? def.definition->getSyntax() : nullptr;
            info.isNewConfigRoot = def.configRoot != nullptr;
            if (!info.isNewConfigRoot && resolvedBind.resolvedConfig) {
                info.configBlockSyntax = resolvedBind.resolvedConfig->useConfig.getSyntax();

                // Make a copy of the list; the memory for it is owned by
                // the old compilation that is going away.
                info.liblist = copyFrom(resolvedBind.resolvedConfig->liblist);
            }

            for (auto target : resolvedBind.instTargets)
                binds.emplace_back(BindEntry{OpaqueInstancePath(*target), nullptr, info});

            if (auto defTarget = resolvedBind.defTarget) {
                auto parentScope = defTarget->getParentScope();
                auto defSyntax = defTarget->getSyntax();
                SLANG_ASSERT(parentScope && defSyntax);

                // If this is a nested definition we'll put it into the
                // override node of the parent scope that contains the
                // definition. Otherwise it's a globally targeted bind.
                OpaqueInstancePath path;
                auto& parentSym = parentScope->asSymbol();
                if (parentSym.kind != SymbolKind::CompilationUnit)
                    path = OpaqueInstancePath(parentSym);

                binds.emplace_back(
                    BindEntry{std::move(path), &defSyntax->as<ModuleDeclarationSyntax>(), info});
            }
        }
    };

    auto checkProblem = [&](const DefParamVisitor& visitor) {
        if (visitor.hierarchyProblem) {
            auto& diag = root->addDiag(diag::MaxInstanceDepthExceeded,
                                       visitor.hierarchyProblem->location);
            diag << visitor.hierarchyProblem->getDefinition().getKindString();
            diag << options.maxInstanceDepth;
            return true;
        }
        return false;
    };

    // [23.10.4.1] gives an algorithm for elaboration in the face of defparams.
    // Specifically, we need to resolve all possible defparams at one "level" of
    // hierarchy before moving on to a deeper level, where a "level" in this case
    // is each successive set of nested generate blocks.
    size_t generateLevel = 0;
    size_t numBlocksSeen = 0;
    size_t numBindsSeen = 0;
    size_t numDefParamsSeen = 0;
    while (true) {
        // Traverse the design and find all defparams and their values.
        // defparam resolution happens in a cloned compilation unit because we will be
        // constantly mucking with parameter values in ways that can change the actual
        // hierarchy that gets instantiated. Cloning lets us do that in an isolated context
        // and throw that work away once we know the final parameter values.
        Compilation initialClone({}, defaultLibPtr);
        cloneInto(initialClone);

        size_t currBlocksSeen;
        auto nextIt = [&] {
            // If we haven't found any new blocks we're done iterating.
            SLANG_ASSERT(currBlocksSeen >= numBlocksSeen);
            if (currBlocksSeen == numBlocksSeen)
                return true;

            // Otherwise advance into the next blocks and try again.
            generateLevel++;
            numBlocksSeen = currBlocksSeen;
            return false;
        };

        while (true) {
            DefParamVisitor v(options.maxInstanceDepth, generateLevel);
            initialClone.getRoot(/* skipDefParamsAndBinds */ true).visit(v);
            if (checkProblem(v))
                return;

            currBlocksSeen = v.numBlocksSeen;
            if (v.found.size() > numDefParamsSeen ||
                initialClone.bindDirectives.size() > numBindsSeen) {
                numDefParamsSeen = v.found.size();
                saveState(v, initialClone);
                break;
            }

            // We didn't find any more binds or defparams so increase
            // our generate level and try again.
            if (nextIt()) {
                saveState(v, initialClone);
                break;
            }
        }

        // If we have found more binds, do another visit to let them be applied
        // and potentially add blocks and defparams to our set for this level.
        if (initialClone.bindDirectives.size() > numBindsSeen) {
            // Reset the number of defparams seen to ensure that
            // we re-resolve everything after the next iteration.
            numDefParamsSeen = 0;
            numBindsSeen = initialClone.bindDirectives.size();
            continue;
        }

        // defparams can change the value of parameters, further affecting the value of
        // other defparams elsewhere in the design. This means we need to iterate,
        // reevaluating defparams until they all settle to a stable value or until we
        // give up due to the potential of cyclical references.
        bool allSame = true;
        for (uint32_t i = 0; i < options.maxDefParamSteps; i++) {
            Compilation c({}, defaultLibPtr);
            cloneInto(c);

            DefParamVisitor v(options.maxInstanceDepth, generateLevel);
            c.getRoot(/* skipDefParamsAndBinds */ true).visit(v);
            if (checkProblem(v))
                return;

            // We're only done if we have the same set of defparams with the same set of values.
            allSame = true;
            SLANG_ASSERT(v.found.size() == overrides.size());
            for (size_t j = 0; j < v.found.size(); j++) {
                // Check that the defparam resolved to the same target we saw previously.
                // The spec declares it to be an error if a defparam target changes based
                // on elaboration of other defparam values.
                const SyntaxNode* targetNode = nullptr;
                auto target = v.found[j]->getTarget();
                if (target)
                    targetNode = target->getSyntax();

                auto getRange = [&] {
                    auto syntax = v.found[j]->getSyntax();
                    SLANG_ASSERT(syntax);
                    return syntax->sourceRange();
                };

                auto& prevEntry = overrides[j];
                if (prevEntry.targetSyntax && targetNode && prevEntry.targetSyntax != targetNode) {
                    auto& diag = root->addDiag(diag::DefParamTargetChange, getRange());
                    diag << prevEntry.pathStr;
                    diag << target->getHierarchicalPath();
                    return;
                }

                if (prevEntry.value != v.found[j]->getValue()) {
                    allSame = false;
                    if (i == options.maxDefParamSteps - 1)
                        root->addDiag(diag::DefParamCycle, getRange());
                    break;
                }
            }

            if (allSame)
                break;

            saveState(v, c);
        }

        // If we gave up due to a potential infinite loop, continue exiting.
        if (!allSame)
            break;

        if (nextIt())
            break;
    }

    // We have our final overrides; copy them into the main compilation unit.
    copyStateInto(*this, true);
}